

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O3

_Bool chck_utf8_validate(char *u8)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (u8 == (char *)0x0) {
    __assert_fail("u8",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/unicode/unicode.c"
                  ,0x78,"_Bool chck_utf8_validate(const char *)");
  }
  lVar2 = 0;
  do {
    if (((&DAT_001023d0)[lVar2] & *u8) == (&DAT_001023d1)[lVar2]) {
      bVar1 = (&UNK_001023d2)[lVar2];
      if ((ulong)bVar1 != 0) {
        uVar3 = 0;
        uVar4 = 0;
        goto LAB_0010145d;
      }
      break;
    }
    lVar2 = lVar2 + 3;
  } while (lVar2 != 0xf);
  bVar1 = 0;
  uVar3 = 0;
  goto LAB_0010148c;
  while (uVar3 = uVar3 + 1, bVar1 != uVar3) {
LAB_0010145d:
    uVar4 = (ulong)""[uVar4 * 0x10 + (ulong)""[(byte)u8[uVar3]] + 0x100];
    if (uVar4 == 1) goto LAB_0010148c;
  }
  uVar3 = (ulong)bVar1;
LAB_0010148c:
  return (byte)(bVar1 - 1) < (byte)uVar3;
}

Assistant:

bool
chck_utf8_validate(const char u8[4])
{
   assert(u8);

   const uint8_t mb = chck_utf8_mblen(u8);
   uint32_t state = CHCK_UTF8_ACCEPT, cp;
   for (uint8_t i = 0; i < mb; ++i) {
      if (chck_utf8_decode(&state, &cp, u8[i]) == CHCK_UTF8_REJECT)
         return false;
   }

   return (mb > 0);
}